

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O2

int coda_type_text_set_special_text_type
              (coda_type_text *type,coda_ascii_special_text_type special_text_type)

{
  char *pcVar1;
  
  if (type == (coda_type_text *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x7df);
  }
  else if (type->format == coda_format_ascii) {
    if (type->special_text_type == ascii_text_default) {
      type->special_text_type = special_text_type;
      return 0;
    }
    coda_set_error(-400,"text type already has a special text type set");
  }
  else {
    pcVar1 = coda_type_get_format_name(type->format);
    coda_set_error(-400,"special ascii text type not allowed for %s format",pcVar1);
  }
  return -1;
}

Assistant:

int coda_type_text_set_special_text_type(coda_type_text *type, coda_ascii_special_text_type special_text_type)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->format != coda_format_ascii)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "special ascii text type not allowed for %s format",
                       coda_type_get_format_name(type->format));
        return -1;
    }
    if (type->special_text_type != ascii_text_default)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "text type already has a special text type set");
        return -1;
    }
    type->special_text_type = special_text_type;
    return 0;
}